

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  Esperf esperf;
  Options options;
  Esperf local_140;
  Options local_110;
  
  Options::Options(&local_110);
  iVar1 = Options::Parse(&local_110,argc,argv);
  if (iVar1 == 0) {
    Esperf::Esperf(&local_140,&local_110);
    Esperf::Run(&local_140);
  }
  Options::~Options(&local_110);
  return 0;
}

Assistant:

int main(int argc, char **argv) {

    // parse command line options_
    Options options;
    if (options.Parse(argc, argv) == EXIT_SUCCESS){
        // run esperf
        Esperf esperf(&options);
        esperf.Run();
    };

    return EXIT_SUCCESS;
}